

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::CrateReader::GetFieldValuePair
          (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,FieldValuePairVector *fvs,string *name,
          string *tyname)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  size_t __n;
  vtable_type *pvVar3;
  size_type sVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *ppVar5;
  undefined8 uVar6;
  int iVar7;
  long *plVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  _Alloc_hider _Var11;
  ulong *puVar12;
  pointer ppVar13;
  bool bVar14;
  string local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  undefined8 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppVar13 = (fvs->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
              *)__return_storage_ptr__;
  do {
    if (ppVar13 == ppVar2) {
      ::std::operator+(&local_50,"FieldValuePair not found with name: `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_80 = *plVar9;
        lStack_78 = plVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar9;
        local_90 = (long *)*plVar8;
      }
      local_88 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(tyname->_M_dataplus)._M_p);
      ppVar5 = local_b8;
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar8;
      }
      local_68 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)::std::__cxx11::string::append((char *)&local_70);
      local_b0 = &local_a0;
      puVar12 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_a0._M_allocated_capacity = *puVar12;
        local_a0._8_8_ = plVar8[3];
        paVar10 = local_b0;
      }
      else {
        local_a0._M_allocated_capacity = *puVar12;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8;
      }
      uVar6 = local_a0._M_allocated_capacity;
      sVar4 = plVar8[1];
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      if (paVar10 == local_b0) {
        local_d8.field_2._8_8_ = local_a0._8_8_;
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p;
      }
      local_a8 = 0;
      local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffffffffff00;
      *(bool *)&ppVar5[1].first._M_dataplus._M_p = false;
      paVar1 = &(((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                   *)&ppVar5->first)->
                super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).field_0.m_value.first.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&(((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)&ppVar5->first)->
            super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).field_0 = paVar1;
      if (paVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p) {
        paVar1->_M_allocated_capacity = uVar6;
        *(undefined8 *)
         ((long)&(((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&ppVar5->first)->
                 super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).field_0.m_value.first.field_2 + 8) = local_d8.field_2._8_8_;
      }
      else {
        (((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)&ppVar5->first)->
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0.m_value.first._M_dataplus._M_p = (pointer)paVar10;
        (((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
           *)&ppVar5->first)->
        super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ).field_0.m_value.first.field_2._M_allocated_capacity = uVar6;
      }
      (((storage_t<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
         *)&ppVar5->first)->
      super_storage_t_impl<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).field_0.m_value.first._M_string_length = sVar4;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_allocated_capacity = uVar6 & 0xffffffffffffff00;
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)ppVar5;
    }
    __n = (ppVar13->first)._M_string_length;
    if ((__n == name->_M_string_length) &&
       ((__n == 0 ||
        (iVar7 = bcmp((ppVar13->first)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n), iVar7 == 0)))
       ) {
      pvVar3 = (ppVar13->second).value_.v_.vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 4;
        local_d8.field_2._M_allocated_capacity._0_5_ = 0x64696f76;
        if (tyname->_M_string_length != 4) goto LAB_001c8a45;
LAB_001c8a33:
        _Var11._M_p = local_d8._M_dataplus._M_p;
        iVar7 = bcmp(local_d8._M_dataplus._M_p,(tyname->_M_dataplus)._M_p,local_d8._M_string_length)
        ;
        bVar14 = iVar7 == 0;
      }
      else {
        (*pvVar3->type_name)(&local_d8);
        if (local_d8._M_string_length == tyname->_M_string_length) {
          if (local_d8._M_string_length != 0) goto LAB_001c8a33;
          bVar14 = true;
          _Var11._M_p = local_d8._M_dataplus._M_p;
        }
        else {
LAB_001c8a45:
          bVar14 = false;
          _Var11._M_p = local_d8._M_dataplus._M_p;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var11._M_p != &local_d8.field_2) {
        operator_delete(_Var11._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      ppVar5 = local_b8;
      if (bVar14) {
        *(undefined1 *)&local_b8[1].first._M_dataplus._M_p = 1;
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>
        ::pair(local_b8,ppVar13);
        return (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)ppVar5;
      }
    }
    ppVar13 = ppVar13 + 1;
  } while( true );
}

Assistant:

nonstd::expected<FieldValuePair, std::string>
CrateReader::GetFieldValuePair(const FieldValuePairVector &fvs,
                               const std::string &name,
                               const std::string &tyname) {
  for (const auto &fv : fvs) {
    if ((fv.first == name) && (fv.second.type_name() == tyname)) {
      return fv;
    }
  }

  return nonstd::make_unexpected("FieldValuePair not found with name: `" +
                                 name + "` and specified type: `" + tyname +
                                 "`");
}